

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::iterate(GridRenderCase *this)

{
  ObjectTraits **ppOVar1;
  uint uVar2;
  RenderContext *pRVar3;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  bool bVar4;
  pointer pSVar5;
  int y;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)3> *this_00;
  TestLog *pTVar8;
  TestError *this_01;
  runtime_error *this_02;
  byte bVar9;
  undefined8 uVar10;
  void *__n;
  ConstPixelBufferAccess *pCVar11;
  ConstPixelBufferAccess *__return_storage_ptr__;
  int x;
  int iVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char *description;
  int layerNdx;
  ulong uVar13;
  GridRenderCase *pGVar14;
  long lVar15;
  int ndx;
  long lVar16;
  Surface *this_03;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  GridRenderCase *pGVar17;
  allocator<char> local_466;
  allocator<char> local_465;
  allocator<char> local_464;
  allocator<char> local_463;
  allocator<char> local_462;
  allocator<char> local_461;
  long local_460;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> renderedLayers;
  undefined1 local_440 [32];
  Surface errorMask;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  ConstPixelBufferAccess local_328;
  Framebuffer clearFbo;
  ConstPixelBufferAccess local_180;
  Framebuffer readFbo;
  VertexArray vao;
  
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
            (&renderedLayers,(long)this->m_numLayers,(allocator_type *)&clearFbo);
  lVar15 = 0;
  for (lVar16 = 0; lVar16 < this->m_numLayers; lVar16 = lVar16 + 1) {
    tcu::Surface::setSize
              ((Surface *)
               ((long)&(renderedLayers.
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_width + lVar15),0x100,0x100);
    lVar15 = lVar15 + 0x18;
  }
  clearFbo.super_ObjectWrapper.m_gl =
       (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppOVar1 = &clearFbo.super_ObjectWrapper.m_traits;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
  std::operator<<((ostream *)ppOVar1,
                  "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&clearFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
  pGVar17 = this;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar6);
  iVar6 = (**(code **)(lVar15 + 0x780))((this->m_program->m_program).m_program,"a_position");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  fbo.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  if (iVar6 == -1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&clearFbo,"Attribute a_position location was -1",
               (allocator<char> *)&readFbo);
    tcu::TestError::TestError(this_01,(string *)&clearFbo);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar15 + 0x1a00))
            (0,0,(renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                  _M_impl.super__Vector_impl_data._M_start)->m_width,
             (renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl
              .super__Vector_impl_data._M_start)->m_height);
  (**(code **)(lVar15 + 0x1c0))(0,0,0,0x3f800000);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x98b);
  (**(code **)(lVar15 + 0xd8))(vao.super_ObjectWrapper.m_object);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"bind vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x98e);
  (**(code **)(lVar15 + 0x1680))((this->m_program->m_program).m_program);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x991);
  (**(code **)(lVar15 + 0xfd8))(0x8e72,1);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar7,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x994);
  (**(code **)(lVar15 + 0x1858))(0,0,0,0x3f800000,iVar6);
  if ((this->m_flags & 0x200) == 0) {
    (**(code **)(lVar15 + 0x188))(0x4000);
    pGVar14 = pGVar17;
  }
  else {
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (&clearFbo,((this->super_TestCase).m_context)->m_renderCtx);
    (**(code **)(lVar15 + 0x78))(0x8d40,clearFbo.super_ObjectWrapper.m_object);
    for (iVar6 = 0; iVar6 < this->m_numLayers; iVar6 = iVar6 + 1) {
      (**(code **)(lVar15 + 0x6b8))(0x8d40,0x8ce0,this->m_texture,0,iVar6);
      (**(code **)(lVar15 + 0x188))(0x4000);
    }
    dVar7 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar7,"clear tex contents",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9a5);
    glu::ObjectWrapper::~ObjectWrapper(&clearFbo.super_ObjectWrapper);
    this_00 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (this_00,((pGVar17->super_TestCase).m_context)->m_renderCtx);
    clearFbo.super_ObjectWrapper.m_gl = (Functions *)0x0;
    data.ptr._7_1_ = in_stack_fffffffffffffb8f;
    data.ptr._0_7_ = in_stack_fffffffffffffb88;
    data._8_8_ = pGVar17;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::assignData(&fbo.
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 ,data);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   *)&clearFbo);
    pGVar14 = pGVar17;
    (**(code **)(lVar15 + 0x78))
              (0x8d40,((fbo.
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar15 + 0x690))(0x8d40,0x8ce0,pGVar17->m_texture,0);
    dVar7 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar7,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9ae);
  }
  (**(code **)(lVar15 + 0x538))(0xe,0,1);
  dVar7 = (**(code **)(lVar15 + 0x800))();
  if ((dVar7 == 0x505) && ((pGVar14->m_flags & 0x400) != 0)) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"got GL_OUT_OF_MEMORY while drawing");
    *(undefined ***)this_02 = &PTR__runtime_error_01e5d430;
    __cxa_throw(this_02,&Functional::(anonymous_namespace)::AllowedRenderFailureException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  uVar10 = 0x9c0;
  glu::checkError(dVar7,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x9c0);
  pGVar17 = pGVar14;
  if ((pGVar14->m_flags & 0x200) == 0) {
    pRVar3 = ((pGVar14->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&clearFbo,
               renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&clearFbo);
    dVar7 = (**(code **)(lVar15 + 0x800))();
    uVar10 = 0x9d4;
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x9d4);
  }
  else {
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (&readFbo,((pGVar14->super_TestCase).m_context)->m_renderCtx);
    (**(code **)(lVar15 + 0x78))(0x8d40,readFbo.super_ObjectWrapper.m_object);
    lVar16 = 0;
    for (uVar13 = 0; (long)uVar13 < (long)pGVar14->m_numLayers; uVar13 = uVar13 + 1) {
      (**(code **)(lVar15 + 0x6b8))(0x8d40,0x8ce0,pGVar14->m_texture,0,uVar13 & 0xffffffff);
      pRVar3 = ((pGVar14->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&clearFbo,
                 (Surface *)
                 ((long)&(renderedLayers.
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_width + lVar16));
      pGVar14 = pGVar17;
      glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&clearFbo);
      pGVar17 = pGVar14;
      dVar7 = (**(code **)(lVar15 + 0x800))();
      uVar10 = 0x9ce;
      glu::checkError(dVar7,"read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x9ce);
      lVar16 = lVar16 + 0x18;
    }
    glu::ObjectWrapper::~ObjectWrapper(&readFbo.super_ObjectWrapper);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase(&fbo.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               );
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&vao);
  __n = (void *)CONCAT71((int7)((ulong)uVar10 >> 8),1);
  lVar15 = 0;
  while (pSVar5 = renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                  _M_impl.super__Vector_impl_data._M_start, bVar9 = (byte)__n,
        lVar15 < pGVar14->m_numLayers) {
    local_460 = lVar15;
    tcu::Surface::Surface
              (&errorMask,
               renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15].m_width,
               renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar15].m_height);
    tcu::Surface::getAccess((PixelBufferAccess *)&clearFbo,&errorMask);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x3f80000000000000;
    vao.super_ObjectWrapper.m_traits = (ObjectTraits *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)&clearFbo,(Vec4 *)&vao);
    clearFbo.super_ObjectWrapper.m_gl =
         (Functions *)((pGVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppOVar1 = &clearFbo.super_ObjectWrapper.m_traits;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
    std::operator<<((ostream *)ppOVar1,"Verifying output layer ");
    std::ostream::operator<<(ppOVar1,(int)local_460);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&clearFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
    this_03 = pSVar5 + lVar15;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
    bVar4 = false;
    for (iVar6 = 0; iVar6 < this_03->m_height; iVar6 = iVar6 + 1) {
      __n = (this_03->m_pixels).m_ptr;
      for (iVar12 = 0; iVar12 < this_03->m_width; iVar12 = iVar12 + 1) {
        uVar2 = *(uint *)((long)__n + (long)(this_03->m_width * iVar6 + iVar12) * 4);
        if ((uVar2 & 0xff00) < 0xf700 || 0x80000 < (uVar2 & 0xff0000)) {
          *(undefined4 *)
           ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar6 + iVar12) * 4) =
               0xff0000ff;
          bVar4 = true;
        }
      }
    }
    if (bVar4) {
      clearFbo.super_ObjectWrapper.m_gl =
           (Functions *)((pGVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppOVar1 = &clearFbo.super_ObjectWrapper.m_traits;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
      std::operator<<((ostream *)ppOVar1,"Image verification failed, found invalid pixels.");
      pTVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&clearFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"ImageVerification",&local_461);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Image verification",&local_462);
      tcu::LogImageSet::LogImageSet((LogImageSet *)&fbo,(string *)local_440,&local_408);
      iVar6 = (int)pTVar8;
      tcu::LogImageSet::write((LogImageSet *)&fbo,iVar6,__buf,(size_t)__n);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Result",&local_463);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"Rendered result",&local_464);
      pCVar11 = &local_328;
      tcu::Surface::getAccess(pCVar11,this_03);
      tcu::LogImage::LogImage
                ((LogImage *)&vao,&local_388,&local_3a8,pCVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&vao,iVar6,__buf_00,(size_t)pCVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"ErrorMask",&local_465);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"Error mask",&local_466);
      __return_storage_ptr__ = &local_180;
      tcu::Surface::getAccess((PixelBufferAccess *)__return_storage_ptr__,&errorMask);
      tcu::LogImage::LogImage
                ((LogImage *)&readFbo,&local_3c8,&local_3e8,__return_storage_ptr__,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&readFbo,iVar6,__buf_01,(size_t)__return_storage_ptr__);
      tcu::TestLog::endImageSet(pTVar8);
      tcu::LogImage::~LogImage((LogImage *)&readFbo);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c8);
      tcu::LogImage::~LogImage((LogImage *)&vao);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_388);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&fbo);
      std::__cxx11::string::~string((string *)&local_408);
      pCVar11 = (ConstPixelBufferAccess *)local_440;
      pGVar14 = pGVar17;
    }
    else {
      clearFbo.super_ObjectWrapper.m_gl =
           (Functions *)((pGVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppOVar1 = &clearFbo.super_ObjectWrapper.m_traits;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
      std::operator<<((ostream *)ppOVar1,"Image valid.");
      pTVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&clearFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"ImageVerification",(allocator<char> *)&local_388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"Image verification",(allocator<char> *)&local_3a8);
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&readFbo,(string *)&local_328,(string *)&local_180);
      tcu::LogImageSet::write((LogImageSet *)&readFbo,(int)pTVar8,__buf_02,(size_t)__n);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"Result",(allocator<char> *)&local_3c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Rendered result",(allocator<char> *)&local_3e8);
      __return_storage_ptr__ = (ConstPixelBufferAccess *)&fbo;
      tcu::Surface::getAccess(__return_storage_ptr__,this_03);
      tcu::LogImage::LogImage
                ((LogImage *)&vao,(string *)local_440,&local_408,__return_storage_ptr__,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&vao,(int)pTVar8,__buf_03,(size_t)__return_storage_ptr__);
      tcu::TestLog::endImageSet(pTVar8);
      tcu::LogImage::~LogImage((LogImage *)&vao);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)local_440);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&readFbo);
      std::__cxx11::string::~string((string *)&local_180);
      pCVar11 = &local_328;
      pGVar14 = pGVar17;
    }
    std::__cxx11::string::~string((string *)pCVar11);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&clearFbo.super_ObjectWrapper.m_traits);
    tcu::Surface::~Surface(&errorMask);
    __n = (void *)CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),bVar9 & (bVar4 ^ 1U));
    pGVar17 = pGVar14;
    lVar15 = local_460 + 1;
  }
  description = "Image verification failed";
  if (((ulong)__n & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pGVar14->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar9 & QP_TEST_RESULT_FAIL,description);
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector(&renderedLayers);
  return STOP;
}

Assistant:

GridRenderCase::IterateResult GridRenderCase::iterate (void)
{
	std::vector<tcu::Surface>	renderedLayers	(m_numLayers);
	bool						allLayersOk		= true;

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		renderedLayers[ndx].setSize(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)." << tcu::TestLog::EndMessage;

	try
	{
		renderTo(renderedLayers);
	}
	catch (const AllowedRenderFailureException& ex)
	{
		// Got accepted failure
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Could not render, reason: " << ex.what() << "\n"
			<< "Failure is allowed."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		allLayersOk &= verifyResultLayer(ndx, renderedLayers[ndx]);

	if (allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	return STOP;
}